

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

CRollingBloomFilter * __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::RecentRejectsReconsiderableFilter(PeerManagerImpl *this)

{
  __uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> __p;
  CRollingBloomFilter *pCVar1;
  long in_FS_OFFSET;
  undefined4 local_24;
  __uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (this->m_lazy_recent_rejects_reconsiderable)._M_t.
           super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>.
           _M_t.
           super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
           super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl;
  if (pCVar1 == (CRollingBloomFilter *)0x0) {
    local_24 = 120000;
    std::make_unique<CRollingBloomFilter,int,double>((int *)&local_20,(double *)&local_24);
    __p._M_t.
    super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
    super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
         super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>.
    super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl =
         (tuple<CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>)
         (_Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>)0x0;
    std::__uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::reset
              ((__uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *)
               &this->m_lazy_recent_rejects_reconsiderable,
               (pointer)__p._M_t.
                        super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>
                        .super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl);
    std::unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>::~unique_ptr
              ((unique_ptr<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_> *)
               &local_20);
    pCVar1 = (this->m_lazy_recent_rejects_reconsiderable)._M_t.
             super___uniq_ptr_impl<CRollingBloomFilter,_std::default_delete<CRollingBloomFilter>_>.
             _M_t.
             super__Tuple_impl<0UL,_CRollingBloomFilter_*,_std::default_delete<CRollingBloomFilter>_>
             .super__Head_base<0UL,_CRollingBloomFilter_*,_false>._M_head_impl;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pCVar1;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(m_tx_download_mutex)
    {
        AssertLockHeld(m_tx_download_mutex);

        if (!m_lazy_recent_rejects_reconsiderable) {
            m_lazy_recent_rejects_reconsiderable = std::make_unique<CRollingBloomFilter>(120'000, 0.000'001);
        }

        return *m_lazy_recent_rejects_reconsiderable;
    }